

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

boolean load_special(level *lev,char *name)

{
  boolean bVar1;
  int iVar2;
  dlb *dp;
  undefined1 local_48 [8];
  version_info vers_info;
  boolean result;
  sp_lev lvl;
  dlb *fd;
  char *name_local;
  level *lev_local;
  
  vers_info.feature_set._3_1_ = '\0';
  dp = dlb_fopen(name,"r");
  if (dp == (dlb *)0x0) {
    lev_local._7_1_ = '\0';
  }
  else {
    iVar2 = dlb_fread(local_48,0xc,1,dp);
    if (iVar2 == 1) {
      bVar1 = check_version((version_info *)local_48,name,'\x01');
      if (bVar1 != '\0') {
        vers_info.feature_set._3_1_ = sp_level_loader(lev,dp,(sp_lev *)&vers_info.entity_count);
        if (vers_info.feature_set._3_1_ != '\0') {
          vers_info.feature_set._3_1_ = sp_level_coder(lev,(sp_lev *)&vers_info.entity_count);
        }
        sp_level_free((sp_lev *)&vers_info.entity_count);
      }
      dlb_fclose(dp);
      lev_local._7_1_ = vers_info.feature_set._3_1_;
    }
    else {
      fprintf(_stderr,"read error in load_special\n");
      lev_local._7_1_ = '\0';
    }
  }
  return lev_local._7_1_;
}

Assistant:

boolean load_special(struct level *lev, const char *name)
{
	dlb *fd;
	sp_lev lvl;
	boolean result = FALSE;
	struct version_info vers_info;

	fd = dlb_fopen(name, RDBMODE);
	if (!fd) return FALSE;

	Fread(&vers_info, sizeof vers_info, 1, fd);
	if (!check_version(&vers_info, name, TRUE))
	    goto give_up;

	result = sp_level_loader(lev, fd, &lvl);
	if (result) result = sp_level_coder(lev, &lvl);
	sp_level_free(&lvl);
give_up:
	dlb_fclose(fd);
	return result;

err_out:
	fprintf(stderr, "read error in load_special\n");
	return FALSE;
}